

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

TPZFYsmpMatrix<std::complex<float>_> * __thiscall
TPZFYsmpMatrix<std::complex<float>_>::operator=
          (TPZFYsmpMatrix<std::complex<float>_> *this,TPZVerySparseMatrix<std::complex<float>_> *cp)

{
  _ComplexT _Var1;
  long lVar2;
  bool bVar3;
  long *plVar4;
  pointer ppVar5;
  complex<float> *pcVar6;
  TPZBaseMatrix *in_RSI;
  TPZFYsmpMatrix<std::complex<float>_> *in_RDI;
  complex<float> val;
  int64_t col;
  int64_t row;
  const_iterator it;
  int64_t r;
  int64_t c;
  int64_t count;
  int64_t nrows;
  map<std::pair<long,_long>,_std::complex<float>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>_>
  *in_stack_ffffffffffffff68;
  TPZVec<std::complex<float>_> *in_stack_ffffffffffffff70;
  long lVar7;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_> *this_00;
  _Self local_48;
  _Base_ptr local_40;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_> local_38;
  long local_30;
  long local_28;
  size_type local_20;
  int64_t local_18;
  
  local_18 = TPZBaseMatrix::Rows(in_RSI);
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  local_20 = std::
             map<std::pair<long,_long>,_std::complex<float>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>_>
             ::size((map<std::pair<long,_long>,_std::complex<float>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>_>
                     *)0x1491a05);
  TPZVec<long>::resize((TPZVec<long> *)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68)
  ;
  TPZVec<std::complex<float>_>::resize(in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68)
  ;
  TPZVec<long>::resize((TPZVec<long> *)in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68)
  ;
  plVar4 = TPZVec<long>::operator[](&in_RDI->fIA,0);
  *plVar4 = 0;
  std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>::
  _Rb_tree_const_iterator(&local_38);
  local_28 = 0;
  local_30 = 0;
  local_40 = (_Base_ptr)
             std::
             map<std::pair<long,_long>,_std::complex<float>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>_>
             ::begin(in_stack_ffffffffffffff68);
  local_38._M_node = local_40;
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long,_long>,_std::complex<float>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar3 = std::operator!=(&local_38,&local_48);
    if (!bVar3) break;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
                           *)in_stack_ffffffffffffff70);
    lVar7 = (ppVar5->first).first;
    if (local_30 != lVar7) {
      while (lVar2 = local_28, local_30 = local_30 + 1, local_30 < lVar7) {
        plVar4 = TPZVec<long>::operator[](&in_RDI->fIA,local_30);
        *plVar4 = lVar2;
      }
      plVar4 = TPZVec<long>::operator[](&in_RDI->fIA,lVar7);
      *plVar4 = lVar2;
      local_30 = lVar7;
    }
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
                           *)in_stack_ffffffffffffff70);
    this_00 = (_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
               *)(ppVar5->first).second;
    plVar4 = TPZVec<long>::operator[](&in_RDI->fJA,local_28);
    *plVar4 = (long)this_00;
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>
                           *)in_stack_ffffffffffffff70);
    _Var1 = (ppVar5->second)._M_value;
    pcVar6 = TPZVec<std::complex<float>_>::operator[](&in_RDI->fA,local_28);
    pcVar6->_M_value = _Var1;
    local_28 = local_28 + 1;
    std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_std::complex<float>_>_>::
    operator++(this_00,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  while (local_30 = local_30 + 1, local_30 <= local_18) {
    lVar7 = local_28;
    plVar4 = TPZVec<long>::operator[](&in_RDI->fIA,local_30);
    *plVar4 = lVar7;
  }
  return in_RDI;
}

Assistant:

TPZFYsmpMatrix<TVar> &TPZFYsmpMatrix<TVar>::operator=(const TPZVerySparseMatrix<TVar> &cp)
{
	// Deletes everything associated with a TPZFYsmpMatrix
	int64_t nrows = cp.Rows();
	
	int64_t count = 0, c = 0, r = 0;
	
	count = cp.fExtraSparseData.size();
	fJA.resize(count);
    fA.resize(count);
    fIA.resize(nrows+1);
	fIA[0] = 0;
	
	typename map< pair<int64_t,int64_t>, TVar>::const_iterator it;
	c = 0;
	r = 0;
	for(it=cp.fExtraSparseData.begin(); it!= cp.fExtraSparseData.end(); it++)
	{
		int64_t row = it->first.first;
		if(r != row)
		{
			r++;
			while(r < row) 
			{
				fIA[r] = c;
				r++;
			}
			fIA[row] = c;
			r = row;
		}
		int64_t col = it->first.second;
		fJA[c] = col;
		TVar val = it->second;
		fA[c] = val;
		c++;
	}
	r++;
	while(r<=nrows)
	{
		fIA[r] = c;
		r++;
	}
	return *this;
}